

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_mapper_posix.hpp
# Opt level: O2

void __thiscall tao::pegtl::internal::file_mapper::file_mapper(file_mapper *this,char *filename)

{
  file_opener local_20;
  
  file_opener::file_opener(&local_20,filename);
  file_mapper(this,&local_20);
  file_opener::~file_opener(&local_20);
  return;
}

Assistant:

explicit file_mapper( const char* filename )
               : file_mapper( file_opener( filename ) )
            {
            }